

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O1

DataType __thiscall deqp::sl::ShaderParser::mapDataTypeToken(ShaderParser *this,Token token)

{
  DataType DVar1;
  
  DVar1 = TYPE_INVALID;
  if (token - TOKEN_FLOAT < 0x19) {
    DVar1 = *(DataType *)(&DAT_01bc9e4c + (ulong)(token - TOKEN_FLOAT) * 4);
  }
  return DVar1;
}

Assistant:

DataType ShaderParser::mapDataTypeToken(Token token)
{
	switch (token)
	{
	case TOKEN_FLOAT:
		return TYPE_FLOAT;
	case TOKEN_FLOAT_VEC2:
		return TYPE_FLOAT_VEC2;
	case TOKEN_FLOAT_VEC3:
		return TYPE_FLOAT_VEC3;
	case TOKEN_FLOAT_VEC4:
		return TYPE_FLOAT_VEC4;
	case TOKEN_FLOAT_MAT2:
		return TYPE_FLOAT_MAT2;
	case TOKEN_FLOAT_MAT2X3:
		return TYPE_FLOAT_MAT2X3;
	case TOKEN_FLOAT_MAT2X4:
		return TYPE_FLOAT_MAT2X4;
	case TOKEN_FLOAT_MAT3X2:
		return TYPE_FLOAT_MAT3X2;
	case TOKEN_FLOAT_MAT3:
		return TYPE_FLOAT_MAT3;
	case TOKEN_FLOAT_MAT3X4:
		return TYPE_FLOAT_MAT3X4;
	case TOKEN_FLOAT_MAT4X2:
		return TYPE_FLOAT_MAT4X2;
	case TOKEN_FLOAT_MAT4X3:
		return TYPE_FLOAT_MAT4X3;
	case TOKEN_FLOAT_MAT4:
		return TYPE_FLOAT_MAT4;
	case TOKEN_INT:
		return TYPE_INT;
	case TOKEN_INT_VEC2:
		return TYPE_INT_VEC2;
	case TOKEN_INT_VEC3:
		return TYPE_INT_VEC3;
	case TOKEN_INT_VEC4:
		return TYPE_INT_VEC4;
	case TOKEN_UINT:
		return TYPE_UINT;
	case TOKEN_UINT_VEC2:
		return TYPE_UINT_VEC2;
	case TOKEN_UINT_VEC3:
		return TYPE_UINT_VEC3;
	case TOKEN_UINT_VEC4:
		return TYPE_UINT_VEC4;
	case TOKEN_BOOL:
		return TYPE_BOOL;
	case TOKEN_BOOL_VEC2:
		return TYPE_BOOL_VEC2;
	case TOKEN_BOOL_VEC3:
		return TYPE_BOOL_VEC3;
	case TOKEN_BOOL_VEC4:
		return TYPE_BOOL_VEC4;
	default:
		return TYPE_INVALID;
	}
}